

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

mi_subproc_id_t mi_subproc_new(void)

{
  mi_subproc_t *subproc;
  mi_memid_t memid;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  _mi_memid_none();
  local_8 = _mi_arena_meta_zalloc(memid.mem.arena.block_index,(mi_memid_t *)subproc);
  if (local_8 == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    *(undefined8 *)((long)local_8 + 0x70) = local_20;
    *(undefined8 *)((long)local_8 + 0x78) = local_18;
    *(undefined8 *)((long)local_8 + 0x80) = local_10;
    *(undefined8 *)((long)local_8 + 0x60) = 0;
    mi_lock_init((pthread_mutex_t *)0xb1ef4e);
    mi_lock_init((pthread_mutex_t *)0xb1ef5b);
  }
  return local_8;
}

Assistant:

mi_subproc_id_t mi_subproc_new(void) {
  mi_memid_t memid = _mi_memid_none();
  mi_subproc_t* subproc = (mi_subproc_t*)_mi_arena_meta_zalloc(sizeof(mi_subproc_t), &memid);
  if (subproc == NULL) return NULL;
  subproc->memid = memid;
  subproc->abandoned_os_list = NULL;
  mi_lock_init(&subproc->abandoned_os_lock);
  mi_lock_init(&subproc->abandoned_os_visit_lock);
  return subproc;
}